

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::CFIReaderImpl::QName::QName(QName *this,FIQName *qname)

{
  char *__s;
  char *local_60;
  char *local_40;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  FIQName *local_18;
  FIQName *qname_local;
  QName *this_local;
  
  if (qname->prefix == (char *)0x0) {
    local_40 = "";
  }
  else {
    local_40 = qname->prefix;
  }
  local_18 = qname;
  qname_local = (FIQName *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,local_40,&local_19);
  std::allocator<char>::~allocator(&local_19);
  if (local_18->uri == (char *)0x0) {
    local_60 = "";
  }
  else {
    local_60 = local_18->uri;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->uri,local_60,local_2d);
  std::allocator<char>::~allocator(local_2d);
  __s = local_18->name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->name,__s,&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  return;
}

Assistant:

inline QName(const FIQName &qname): prefix(qname.prefix ? qname.prefix : ""), uri(qname.uri ? qname.uri : ""), name(qname.name) {}